

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O3

void __thiscall rlottie::internal::model::PathData::toPath(PathData *this,VPath *path)

{
  pointer pVVar1;
  pointer pVVar2;
  undefined1 auVar3 [16];
  VPathData *pVVar4;
  size_t in_RCX;
  size_t __n;
  void *in_RDX;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar5;
  int iVar6;
  size_t pts;
  ulong uVar8;
  ulong uVar9;
  VPath *pVVar7;
  
  pVVar7 = path;
  pVVar4 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&path->d,(int)path,in_RDX,in_RCX);
  iVar6 = (int)pVVar7;
  VPath::VPathData::reset(pVVar4);
  pVVar1 = (this->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (this->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar1 != pVVar2) {
    uVar9 = (long)pVVar2 - (long)pVVar1 >> 3;
    __n = 0xaaaaaaaaaaaaaaab;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar9;
    pts = uVar9 + 1;
    pVVar4 = (VPathData *)
             vcow_ptr<VPath::VPathData>::write
                       (&path->d,iVar6,SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8),
                        0xaaaaaaaaaaaaaaab);
    VPath::VPathData::reserve(pVVar4,pts,uVar9 / 3 + 2);
    pVVar4 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&path->d,(int)pts,__buf,__n);
    VPath::VPathData::moveTo(pVVar4,pVVar1->mx,pVVar1->my);
    iVar6 = (int)pts;
    pvVar5 = extraout_RDX;
    if (1 < uVar9) {
      uVar8 = 1;
      do {
        pVVar4 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&path->d,(int)pts,pvVar5,__n);
        VPath::VPathData::cubicTo
                  (pVVar4,pVVar1[uVar8].mx,pVVar1[uVar8].my,pVVar1[uVar8 + 1].mx,
                   pVVar1[uVar8 + 1].my,pVVar1[uVar8 + 2].mx,pVVar1[uVar8 + 2].my);
        iVar6 = (int)pts;
        uVar8 = uVar8 + 3;
        pvVar5 = extraout_RDX_00;
      } while (uVar8 < uVar9);
    }
    if (this->mClosed != false) {
      pVVar4 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&path->d,iVar6,pvVar5,__n);
      VPath::VPathData::close(pVVar4,iVar6);
      return;
    }
  }
  return;
}

Assistant:

void toPath(VPath &path) const
    {
        path.reset();

        if (mPoints.empty()) return;

        auto size = mPoints.size();
        auto points = mPoints.data();
        /* reserve exact memory requirement at once
         * ptSize = size + 1(size + close)
         * elmSize = size/3 cubic + 1 move + 1 close
         */
        path.reserve(size + 1, size / 3 + 2);
        path.moveTo(points[0]);
        for (size_t i = 1; i < size; i += 3) {
            path.cubicTo(points[i], points[i + 1], points[i + 2]);
        }
        if (mClosed) path.close();
    }